

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorBase<const_slang::ast::BitTrie_*> * __thiscall
slang::SmallVectorBase<const_slang::ast::BitTrie_*>::operator=
          (SmallVectorBase<const_slang::ast::BitTrie_*> *this,
          SmallVectorBase<const_slang::ast::BitTrie_*> *rhs)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  pointer ppBVar4;
  pointer __dest;
  
  if (this == rhs) {
    return this;
  }
  ppBVar4 = rhs->data_;
  if (ppBVar4 != (pointer)rhs->firstElement) {
    if (this->data_ != (pointer)this->firstElement) {
      operator_delete(this->data_);
    }
    ppBVar4 = rhs->data_;
    rhs->data_ = (pointer)0x0;
    this->data_ = ppBVar4;
    sVar1 = rhs->len;
    rhs->len = 0;
    this->len = sVar1;
    sVar1 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar1;
    return this;
  }
  uVar2 = this->len;
  uVar3 = rhs->len;
  if (uVar2 < uVar3) {
    if (this->cap < uVar3) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar2 != 0) {
      memmove(this->data_,ppBVar4,uVar2 << 3);
    }
    sVar1 = this->len;
    __n = rhs->len * 8 + sVar1 * -8;
    if (__n == 0) goto LAB_0021d4fb;
    ppBVar4 = rhs->data_ + sVar1;
    __dest = this->data_ + sVar1;
  }
  else {
    if (uVar3 == 0) goto LAB_0021d4fb;
    __dest = this->data_;
    __n = uVar3 << 3;
  }
  memmove(__dest,ppBVar4,__n);
LAB_0021d4fb:
  this->len = rhs->len;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}